

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader_mocks.cpp
# Opt level: O0

refiller_function * yield_string(refiller_function *__return_storage_ptr__,string *str)

{
  string local_38 [32];
  string *local_18;
  string *str_local;
  
  local_18 = str;
  str_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string(local_38,(string *)str);
  std::
  function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(int,pstore::gsl::span<unsigned_char,-1l>const&)>
  ::function<yield_string(std::__cxx11::string_const&)::__0,void>
            ((function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>
              *)__return_storage_ptr__,(anon_class_32_1_ba1d7991 *)local_38);
  yield_string(std::__cxx11::string_const&)::$_0::~__0((__0 *)local_38);
  return __return_storage_ptr__;
}

Assistant:

refiller_function yield_string (std::string const & str) {
    return [str] (int io, pstore::gsl::span<std::uint8_t> const & s) {
        PSTORE_ASSERT (str.length () <= pstore::unsigned_cast (s.size ()));
        return refiller_result_type{
            pstore::in_place, io + 1,
            std::transform (str.begin (), str.end (), s.begin (), [] (std::uint8_t v) {
                PSTORE_ASSERT (v < 128);
                return static_cast<char> (v);
            })};
    };
}